

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

Status __thiscall
google::protobuf::compiler::cpp::CppGenerator::ValidateFeatures
          (CppGenerator *this,FileDescriptor *file)

{
  long in_RDX;
  long lVar1;
  long lVar2;
  anon_class_8_1_6bf1c130 local_30;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)0x1;
  local_30.status = (Status *)this;
  if (0 < *(int *)(in_RDX + 0x3c)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/generator.cc:365:55)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_cpp_generator_cc:365:55)>_>
                 *)&local_30,(Descriptor *)(*(long *)(in_RDX + 0x60) + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0xa0;
    } while (lVar2 < *(int *)(in_RDX + 0x3c));
  }
  if (0 < *(int *)(in_RDX + 4)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/generator.cc:365:55)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_cpp_generator_cc:365:55)>_>
                 *)&local_30,(FieldDescriptor *)(*(long *)(in_RDX + 0x78) + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x58;
    } while (lVar2 < *(int *)(in_RDX + 4));
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status CppGenerator::ValidateFeatures(const FileDescriptor* file) const {
  absl::Status status = absl::OkStatus();
  google::protobuf::internal::VisitDescriptors(*file, [&](const FieldDescriptor& field) {
    const FeatureSet& resolved_features = GetResolvedSourceFeatures(field);
    const pb::CppFeatures& unresolved_features =
        GetUnresolvedSourceFeatures(field, pb::cpp);
    if (field.enum_type() != nullptr &&
        resolved_features.GetExtension(::pb::cpp).legacy_closed_enum() &&
        resolved_features.field_presence() == FeatureSet::IMPLICIT) {
      status = absl::FailedPreconditionError(
          absl::StrCat("Field ", field.full_name(),
                       " has a closed enum type with implicit presence."));
    }

    if (field.containing_type() == nullptr ||
        !field.containing_type()->options().map_entry()) {
      // Skip validation of explicit features on generated map fields.  These
      // will be blindly propagated from the original map field, and may violate
      // a lot of these conditions.  Note: we do still validate the
      // user-specified map field.
      if (unresolved_features.has_legacy_closed_enum() &&
          field.cpp_type() != FieldDescriptor::CPPTYPE_ENUM &&
          !IsEnumMapType(field)) {
        status = absl::FailedPreconditionError(
            absl::StrCat("Field ", field.full_name(),
                         " specifies the legacy_closed_enum feature but has "
                         "non-enum type."));
      }
    }

    if ((unresolved_features.string_type() == pb::CppFeatures::CORD ||
         field.legacy_proto_ctype() == FieldOptions::CORD) &&
        field.is_extension()) {
      status = absl::FailedPreconditionError(
          absl::StrCat("Extension ", field.full_name(),
                       " specifies CORD string type which is not supported "
                       "for extensions."));
    }

    if ((unresolved_features.has_string_type() ||
         field.has_legacy_proto_ctype()) &&
        field.cpp_type() != FieldDescriptor::CPPTYPE_STRING) {
      status = absl::FailedPreconditionError(absl::StrCat(
          "Field ", field.full_name(),
          " specifies string_type, but is not a string nor bytes field."));
    }

    if (unresolved_features.has_string_type() &&
        field.has_legacy_proto_ctype()) {
      status = absl::FailedPreconditionError(absl::StrCat(
          "Field ", field.full_name(),
          " specifies both string_type and ctype which is not supported."));
    }
  });
  return status;
}